

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordStateDTLS_Test::TestBody
          (SSLVersionTest_RecordStateDTLS_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  pointer server_ctx;
  char *pcVar4;
  pointer psVar5;
  pointer psVar6;
  SSL *pSVar7;
  char *in_R9;
  AssertHelper local_1680;
  Message local_1678;
  uint local_1670;
  uint32_t local_166c;
  undefined1 local_1668 [8];
  AssertionResult gtest_ar_77;
  Message local_1650;
  uint local_1648;
  uint32_t local_1644;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_76;
  Message local_1628;
  uint local_1620;
  uint32_t local_161c;
  undefined1 local_1618 [8];
  AssertionResult gtest_ar_75;
  Message local_1600;
  uint local_15f8;
  uint32_t local_15f4;
  undefined1 local_15f0 [8];
  AssertionResult gtest_ar_74;
  AssertHelper local_15c0;
  Message local_15b8;
  int local_15ac;
  undefined1 local_15a8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_1578;
  Message local_1570;
  int local_1564;
  undefined1 local_1560 [8];
  AssertionResult gtest_ar__30;
  Message local_1548;
  int local_1540;
  uint16_t local_153a;
  undefined1 local_1538 [8];
  AssertionResult gtest_ar_73;
  Message local_1520;
  int local_1518;
  uint16_t local_1512;
  undefined1 local_1510 [8];
  AssertionResult gtest_ar_72;
  AssertHelper local_14e0;
  Message local_14d8;
  int local_14cc;
  undefined1 local_14c8 [8];
  AssertionResult gtest_ar__29;
  Message local_14b0;
  int local_14a8;
  int local_14a4;
  undefined1 local_14a0 [8];
  AssertionResult gtest_ar_71;
  Message local_1488;
  int local_1480;
  int local_147c;
  undefined1 local_1478 [8];
  AssertionResult gtest_ar_70;
  Message local_1460;
  int local_1458;
  uint16_t local_1452;
  undefined1 local_1450 [8];
  AssertionResult gtest_ar_69;
  Message local_1438;
  int local_1430;
  uint16_t local_142a;
  undefined1 local_1428 [8];
  AssertionResult gtest_ar_68;
  AssertHelper local_13f8;
  Message local_13f0;
  int local_13e4;
  undefined1 local_13e0 [8];
  AssertionResult gtest_ar__28;
  Message local_13c8;
  int local_13c0;
  int local_13bc;
  undefined1 local_13b8 [8];
  AssertionResult gtest_ar_67;
  Message local_13a0;
  int local_1398;
  int local_1394;
  undefined1 local_1390 [8];
  AssertionResult gtest_ar_66;
  Message local_1378;
  int local_1370;
  int local_136c;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar_65;
  Message local_1350;
  int local_1348;
  uint16_t local_1342;
  undefined1 local_1340 [8];
  AssertionResult gtest_ar_64;
  AssertHelper local_1310;
  Message local_1308;
  bool local_12f9;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar__27;
  Message local_12e0;
  uint local_12d4;
  uint64_t local_12d0;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar_63;
  Message local_12b0;
  int local_12a8;
  uint16_t local_12a2;
  undefined1 local_12a0 [8];
  AssertionResult gtest_ar_62;
  Message local_1288;
  int local_1280;
  int local_127c;
  undefined1 local_1278 [8];
  AssertionResult gtest_ar_61;
  Message local_1260;
  int local_1258;
  int local_1254;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar_60;
  Message local_1238;
  int local_1230;
  int local_122c;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_59;
  Message local_1210;
  int local_1208;
  uint16_t local_1202;
  undefined1 local_1200 [8];
  AssertionResult gtest_ar_58;
  AssertHelper local_11d0;
  Message local_11c8;
  bool local_11b9;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar__26;
  Message local_11a0;
  int local_1198;
  int local_1194;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_57;
  Message local_1178;
  int local_1170;
  int local_116c;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar_56;
  AssertHelper local_1138;
  Message local_1130;
  bool local_1121;
  undefined1 local_1120 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_10f0;
  Message local_10e8;
  int local_10dc;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar__24;
  Message local_10c0;
  uint32_t local_10b4;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_55;
  Message local_1098;
  uint local_108c;
  undefined1 local_1088 [8];
  AssertionResult gtest_ar_54;
  uint32_t server_hs_seq;
  Message local_1068;
  uint32_t local_105c;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar_53;
  Message local_1040;
  uint local_1034;
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_52;
  uint32_t client_hs_seq;
  Message local_1010;
  unsigned_long local_1008;
  uint64_t local_1000;
  undefined1 local_ff8 [8];
  AssertionResult gtest_ar_51;
  Message local_fe0;
  unsigned_long local_fd8;
  uint64_t local_fd0;
  undefined1 local_fc8 [8];
  AssertionResult gtest_ar_50;
  Message local_fb0;
  int local_fa8;
  int local_fa4;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_49;
  Message local_f88;
  int local_f80;
  int local_f7c;
  undefined1 local_f78 [8];
  AssertionResult gtest_ar_48;
  uint64_t old_seq;
  Message local_f58;
  uint64_t local_f50;
  uint64_t local_f48;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar_47;
  AssertHelper local_f10;
  Message local_f08;
  int local_efc;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar__23;
  Message local_ee0;
  int local_ed8;
  int local_ed4;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar_46;
  Message local_eb8;
  int local_eb0;
  int local_eac;
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar_45;
  Message local_e90;
  uint local_e84;
  uint64_t local_e80;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_44;
  Message local_e60;
  uint64_t local_e58;
  uint64_t local_e50;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_43;
  AssertHelper local_e18;
  Message local_e10;
  int local_e04;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar__22;
  Message local_de8;
  int local_de0;
  int local_ddc;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_42;
  Message local_dc0;
  int local_db8;
  int local_db4;
  undefined1 local_db0 [8];
  AssertionResult gtest_ar_41;
  Message local_d98;
  int local_d90;
  int local_d8c;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar_40;
  uint8_t byte;
  Message local_d68;
  uint local_d5c;
  uint64_t local_d58;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_39;
  Message local_d38;
  uint local_d2c;
  uint64_t local_d28;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar_38;
  Message local_d08;
  uint local_cfc;
  uint64_t local_cf8;
  undefined1 local_cf0 [8];
  AssertionResult gtest_ar_37;
  Message local_cd8;
  uint local_ccc;
  uint64_t local_cc8;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_36;
  AssertHelper local_c90;
  Message local_c88;
  int local_c7c;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_c48;
  Message local_c40;
  int local_c34;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar__20;
  Message local_c18;
  unsigned_long local_c10;
  uint64_t local_c08;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar_35;
  Message local_be8;
  unsigned_long local_be0;
  uint64_t local_bd8;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_34;
  anon_class_16_2_625711b6 check_matching_secret;
  Message local_ba8;
  int local_ba0;
  uint16_t local_b9a;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_33;
  Message local_b80;
  int local_b78;
  uint16_t local_b72;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_32;
  Message local_b58;
  int local_b50;
  uint16_t local_b4a;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_31;
  Message local_b30;
  int local_b28;
  uint16_t local_b22;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_30;
  AssertHelper local_af0;
  Message local_ae8;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_aa8;
  Message local_aa0;
  bool local_a91;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar__18;
  Message local_a78;
  uint local_a6c;
  uint64_t local_a68;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_29;
  Message local_a48;
  uint local_a3c;
  uint64_t local_a38;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_28;
  Message local_a18;
  uint local_a0c;
  uint64_t local_a08;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_27;
  Message local_9e8;
  uint local_9dc;
  uint64_t local_9d8;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_26;
  Message local_9b8;
  int local_9b0;
  int local_9ac;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_25;
  Message local_990;
  int local_988;
  int local_984;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_24;
  undefined1 local_968 [7];
  uint8_t byte_1;
  AssertHelper local_948;
  Message local_940;
  bool local_931;
  undefined1 local_930 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__14;
  Message local_840;
  uint local_834;
  uint64_t local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_23;
  Message local_810;
  uint local_804;
  uint64_t local_800;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_22;
  Message local_7e0;
  uint local_7d4;
  uint64_t local_7d0;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_21;
  Message local_7b0;
  uint local_7a4;
  uint64_t local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_20;
  Message local_780;
  int local_778;
  uint16_t local_772;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_19;
  Message local_758;
  int local_750;
  uint16_t local_74a;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_18;
  Message local_730;
  int local_728;
  uint16_t local_722;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_17;
  Message local_708;
  int local_700;
  uint16_t local_6fa;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_6c8;
  Message local_6c0;
  int local_6b4;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_680;
  Message local_678;
  int local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_638;
  Message local_630;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_5f0;
  Message local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_5a8;
  Message local_5a0;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__7;
  Message local_4e8;
  unsigned_long local_4e0;
  uint64_t local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_15;
  Message local_4b8;
  unsigned_long local_4b0;
  uint64_t local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_14;
  Message local_488;
  unsigned_long local_480;
  uint64_t local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_13;
  Message local_458;
  unsigned_long local_450;
  uint64_t local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_410;
  Message local_408;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_3c8;
  Message local_3c0;
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_338;
  Message local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__3;
  size_t len;
  uint8_t *data;
  Message local_2f8;
  uint local_2f0;
  uint32_t local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0;
  uint local_2c8;
  uint32_t local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8;
  uint local_2a0;
  uint32_t local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_9;
  Message local_280;
  uint local_278;
  uint32_t local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_8;
  Message local_258;
  uint local_24c;
  uint64_t local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  uint local_21c;
  uint64_t local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  uint local_1ec;
  uint64_t local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8;
  uint local_1bc;
  uint64_t local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  int local_190;
  uint16_t local_18a;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  int local_168;
  uint16_t local_162;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  Message local_148;
  int local_140;
  uint16_t local_13a;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  int local_118;
  uint16_t local_112;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48 [3];
  Message local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_RecordStateDTLS_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
  if (bVar1) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).client_ctx_);
    SSL_CTX_set_current_time_cb(psVar3,CurrentTimeCallback);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).server_ctx_);
    SSL_CTX_set_current_time_cb(psVar3,CurrentTimeCallback);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).client_ctx_);
    server_ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
    local_21 = CreateClientAndServer
                         (&(this->super_SSLVersionTest).client_,
                          &(this->super_SSLVersionTest).server_,psVar3,server_ctx);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_20,&local_21,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
    if (!bVar1) {
      testing::Message::Message(&local_30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)local_20,
                 (AssertionResult *)
                 "CreateClientAndServer(&client_, &server_, client_ctx_.get(), server_ctx_.get())",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb1f,pcVar4);
      testing::internal::AssertHelper::operator=(local_48,&local_30);
      testing::internal::AssertHelper::~AssertHelper(local_48);
      std::__cxx11::string::~string((string *)&local_68);
      testing::Message::~Message(&local_30);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      iVar2 = SSL_is_dtls_handshake_idle(psVar5);
      local_81 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_80,&local_81,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
      if (!bVar1) {
        testing::Message::Message(&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_80,
                   (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb22,pcVar4);
        testing::internal::AssertHelper::operator=(&local_98,&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_90);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      iVar2 = SSL_is_dtls_handshake_idle(psVar5);
      local_c9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_c8,
                   (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb23,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_112 = SSL_get_dtls_read_epoch(psVar5);
      local_118 = 0;
      testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                ((EqHelper *)local_110,"SSL_get_dtls_read_epoch(client_.get())","0",&local_112,
                 &local_118);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb26,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_13a = SSL_get_dtls_write_epoch(psVar5);
      local_140 = 0;
      testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                ((EqHelper *)local_138,"SSL_get_dtls_write_epoch(server_.get())","0",&local_13a,
                 &local_140);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb27,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_162 = SSL_get_dtls_read_epoch(psVar5);
      local_168 = 0;
      testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                ((EqHelper *)local_160,"SSL_get_dtls_read_epoch(server_.get())","0",&local_162,
                 &local_168);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb28,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_18a = SSL_get_dtls_write_epoch(psVar5);
      local_190 = 0;
      testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                ((EqHelper *)local_188,"SSL_get_dtls_write_epoch(client_.get())","0",&local_18a,
                 &local_190);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb29,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_1b8 = SSL_get_dtls_read_sequence(psVar5,0);
      local_1bc = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_1b0,"SSL_get_dtls_read_sequence(client_.get(), 0)","0u",
                 &local_1b8,&local_1bc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb2c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_1e8 = SSL_get_dtls_write_sequence(psVar5,0);
      local_1ec = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_1e0,"SSL_get_dtls_write_sequence(server_.get(), 0)","0u",
                 &local_1e8,&local_1ec);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb2d,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_218 = SSL_get_dtls_read_sequence(psVar5,0);
      local_21c = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_210,"SSL_get_dtls_read_sequence(server_.get(), 0)","0u",
                 &local_218,&local_21c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb2e,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_228);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_248 = SSL_get_dtls_write_sequence(psVar5,0);
      local_24c = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_240,"SSL_get_dtls_write_sequence(client_.get(), 0)","0u",
                 &local_248,&local_24c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb2f,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_258);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_274 = SSL_get_dtls_handshake_read_seq(psVar5);
      local_278 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_270,"SSL_get_dtls_handshake_read_seq(client_.get())","0u",
                 &local_274,&local_278);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb32,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_280);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_29c = SSL_get_dtls_handshake_write_seq(psVar5);
      local_2a0 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_298,"SSL_get_dtls_handshake_write_seq(server_.get())","0u",
                 &local_29c,&local_2a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
      if (!bVar1) {
        testing::Message::Message(&local_2a8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb33,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_2a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_2c4 = SSL_get_dtls_handshake_read_seq(psVar5);
      local_2c8 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_2c0,"SSL_get_dtls_handshake_read_seq(server_.get())","0u",
                 &local_2c4,&local_2c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
      if (!bVar1) {
        testing::Message::Message(&local_2d0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb34,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2d0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_2d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_2ec = SSL_get_dtls_handshake_write_seq(psVar5);
      local_2f0 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_2e8,"SSL_get_dtls_handshake_write_seq(client_.get())","0u",
                 &local_2ec,&local_2f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
      if (!bVar1) {
        testing::Message::Message(&local_2f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&data,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb35,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&data,&local_2f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
        testing::Message::~Message(&local_2f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      iVar2 = SSL_get_dtls_read_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,0);
      local_321 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_320,&local_321,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_320,
                   (AssertionResult *)
                   "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 0)","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_338,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb3b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_338,&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_338);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      iVar2 = SSL_get_dtls_write_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,0);
      local_369 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_368,&local_369,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
      if (!bVar1) {
        testing::Message::Message(&local_378);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_368,
                   (AssertionResult *)
                   "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 0)","true","false"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb3d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_380,&local_378);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_378);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      iVar2 = SSL_get_dtls_read_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,0);
      local_3b1 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__6.message_,(internal *)local_3b0,
                   (AssertionResult *)
                   "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 0)","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb3e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_3c8);
        std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
        testing::Message::~Message(&local_3c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      iVar2 = SSL_get_dtls_write_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,0);
      local_3f9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
      if (!bVar1) {
        testing::Message::Message(&local_408);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_12.message_,(internal *)local_3f8,
                   (AssertionResult *)
                   "SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 0)","true","false"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_410,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb40,pcVar4);
        testing::internal::AssertHelper::operator=(&local_410,&local_408);
        testing::internal::AssertHelper::~AssertHelper(&local_410);
        std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_408);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_448 = SSL_get_dtls_read_sequence(psVar5,1);
      local_450 = 0xffffffffffffffff;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_440,"SSL_get_dtls_read_sequence(client_.get(), 1)",
                 "(18446744073709551615UL)",&local_448,&local_450);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
      if (!bVar1) {
        testing::Message::Message(&local_458);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb43,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_458)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_458);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_478 = SSL_get_dtls_write_sequence(psVar5,1);
      local_480 = 0xffffffffffffffff;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_470,"SSL_get_dtls_write_sequence(server_.get(), 1)",
                 "(18446744073709551615UL)",&local_478,&local_480);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb44,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_488)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
        testing::Message::~Message(&local_488);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_4a8 = SSL_get_dtls_read_sequence(psVar5,1);
      local_4b0 = 0xffffffffffffffff;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_4a0,"SSL_get_dtls_read_sequence(server_.get(), 1)",
                 "(18446744073709551615UL)",&local_4a8,&local_4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
      if (!bVar1) {
        testing::Message::Message(&local_4b8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb45,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4b8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
        testing::Message::~Message(&local_4b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_4d8 = SSL_get_dtls_write_sequence(psVar5,1);
      local_4e0 = 0xffffffffffffffff;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_4d0,"SSL_get_dtls_write_sequence(client_.get(), 1)",
                 "(18446744073709551615UL)",&local_4d8,&local_4e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
      if (!bVar1) {
        testing::Message::Message(&local_4e8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb46,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_4e8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
        testing::Message::~Message(&local_4e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      iVar2 = SSL_get_dtls_read_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
      local_501 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_500,&local_501,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
      if (!bVar1) {
        testing::Message::Message(&local_510);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8.message_,(internal *)local_500,
                   (AssertionResult *)
                   "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1)","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_518,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb47,pcVar4);
        testing::internal::AssertHelper::operator=(&local_518,&local_510);
        testing::internal::AssertHelper::~AssertHelper(&local_518);
        std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
        testing::Message::~Message(&local_510);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      iVar2 = SSL_get_dtls_write_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
      local_549 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_548,&local_549,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
      if (!bVar1) {
        testing::Message::Message(&local_558);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__9.message_,(internal *)local_548,
                   (AssertionResult *)
                   "SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1)","true","false"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_560,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb49,pcVar4);
        testing::internal::AssertHelper::operator=(&local_560,&local_558);
        testing::internal::AssertHelper::~AssertHelper(&local_560);
        std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
        testing::Message::~Message(&local_558);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      iVar2 = SSL_get_dtls_read_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
      local_591 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_590,&local_591,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
      if (!bVar1) {
        testing::Message::Message(&local_5a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__10.message_,(internal *)local_590,
                   (AssertionResult *)
                   "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1)","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb4a,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
        testing::internal::AssertHelper::~AssertHelper(&local_5a8);
        std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
        testing::Message::~Message(&local_5a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      iVar2 = SSL_get_dtls_write_traffic_secret
                        (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
      local_5d9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
      if (!bVar1) {
        testing::Message::Message(&local_5e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__11.message_,(internal *)local_5d8,
                   (AssertionResult *)
                   "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1)","true","false"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb4c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
        testing::internal::AssertHelper::~AssertHelper(&local_5f0);
        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
        testing::Message::~Message(&local_5e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_621 = CompleteHandshakes(psVar5,psVar6);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_620,&local_621,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
      if (!bVar1) {
        testing::Message::Message(&local_630);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__12.message_,(internal *)local_620,
                   (AssertionResult *)"CompleteHandshakes(client_.get(), server_.get())","false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_638,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xb4e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_638,&local_630);
        testing::internal::AssertHelper::~AssertHelper(&local_638);
        std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
        testing::Message::~Message(&local_630);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        bVar1 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
        if (bVar1) {
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          iVar2 = SSL_is_dtls_handshake_idle(psVar5);
          local_a91 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_a90,&local_a91,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
          if (!bVar1) {
            testing::Message::Message(&local_aa0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__19.message_,(internal *)local_a90,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_aa8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb7b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_aa8,&local_aa0);
            testing::internal::AssertHelper::~AssertHelper(&local_aa8);
            std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
            testing::Message::~Message(&local_aa0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          iVar2 = SSL_is_dtls_handshake_idle(psVar5);
          local_ad9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
          if (!bVar1) {
            testing::Message::Message(&local_ae8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_30.message_,(internal *)local_ad8,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true","false"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_af0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb7d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
            testing::internal::AssertHelper::~AssertHelper(&local_af0);
            std::__cxx11::string::~string((string *)&gtest_ar_30.message_);
            testing::Message::~Message(&local_ae8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_b22 = SSL_get_dtls_read_epoch(psVar5);
          local_b28 = 3;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_b20,"SSL_get_dtls_read_epoch(client_.get())","3",&local_b22,
                     &local_b28);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
          if (!bVar1) {
            testing::Message::Message(&local_b30);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb80,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_31.message_,&local_b30);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
            testing::Message::~Message(&local_b30);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_b4a = SSL_get_dtls_write_epoch(psVar5);
          local_b50 = 3;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_b48,"SSL_get_dtls_write_epoch(server_.get())","3",&local_b4a,
                     &local_b50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
          if (!bVar1) {
            testing::Message::Message(&local_b58);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb81,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_32.message_,&local_b58);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
            testing::Message::~Message(&local_b58);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_b72 = SSL_get_dtls_read_epoch(psVar5);
          local_b78 = 3;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_b70,"SSL_get_dtls_read_epoch(server_.get())","3",&local_b72,
                     &local_b78);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
          if (!bVar1) {
            testing::Message::Message(&local_b80);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b70);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb82,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_33.message_,&local_b80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
            testing::Message::~Message(&local_b80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_b9a = SSL_get_dtls_write_epoch(psVar5);
          local_ba0 = 3;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_b98,"SSL_get_dtls_write_epoch(client_.get())","3",&local_b9a,
                     &local_ba0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
          if (!bVar1) {
            testing::Message::Message(&local_ba8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&check_matching_secret.len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb83,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&check_matching_secret.len,&local_ba8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)&check_matching_secret.len);
            testing::Message::~Message(&local_ba8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
          gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )&len;
          check_matching_secret.data = (uint8_t **)&gtest_ar__3.message_;
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          TestBody::anon_class_16_2_625711b6::operator()
                    ((anon_class_16_2_625711b6 *)&gtest_ar_34.message_,psVar5,psVar6,3);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          TestBody::anon_class_16_2_625711b6::operator()
                    ((anon_class_16_2_625711b6 *)&gtest_ar_34.message_,psVar5,psVar6,3);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_bd8 = SSL_get_dtls_read_sequence(psVar5,2);
          local_be0 = 0xffffffffffffffff;
          testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                    ((internal *)local_bd0,"SSL_get_dtls_read_sequence(client_.get(), 2)",
                     "(18446744073709551615UL)",&local_bd8,&local_be0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
          if (!bVar1) {
            testing::Message::Message(&local_be8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb95,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_35.message_,&local_be8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
            testing::Message::~Message(&local_be8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_c08 = SSL_get_dtls_read_sequence(psVar5,2);
          local_c10 = 0xffffffffffffffff;
          testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                    ((internal *)local_c00,"SSL_get_dtls_read_sequence(server_.get(), 2)",
                     "(18446744073709551615UL)",&local_c08,&local_c10);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
          if (!bVar1) {
            testing::Message::Message(&local_c18);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c00);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb96,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__20.message_,&local_c18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
            testing::Message::~Message(&local_c18);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_c34 = SSL_get_dtls_read_traffic_secret
                                (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,2);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_c30,&local_c34,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
          if (!bVar1) {
            testing::Message::Message(&local_c40);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__21.message_,(internal *)local_c30,
                       (AssertionResult *)
                       "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 2)","false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_c48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb97,pcVar4);
            testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
            testing::internal::AssertHelper::~AssertHelper(&local_c48);
            std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
            testing::Message::~Message(&local_c40);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_c7c = SSL_get_dtls_read_traffic_secret
                                (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,2);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_c78,&local_c7c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
          if (!bVar1) {
            testing::Message::Message(&local_c88);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_36.message_,(internal *)local_c78,
                       (AssertionResult *)
                       "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 2)","false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_c90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb98,pcVar4);
            testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
            testing::internal::AssertHelper::~AssertHelper(&local_c90);
            std::__cxx11::string::~string((string *)&gtest_ar_36.message_);
            testing::Message::~Message(&local_c88);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_cc8 = SSL_get_dtls_write_sequence(psVar5,3);
          local_ccc = 0;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_cc0,"SSL_get_dtls_write_sequence(client_.get(), 3)","0u",
                     &local_cc8,&local_ccc);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
          if (!bVar1) {
            testing::Message::Message(&local_cd8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb9b,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_37.message_,&local_cd8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
            testing::Message::~Message(&local_cd8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_cf8 = SSL_get_dtls_read_sequence(psVar5,3);
          local_cfc = 0;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_cf0,"SSL_get_dtls_read_sequence(server_.get(), 3)","0u",
                     &local_cf8,&local_cfc);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf0);
          if (!bVar1) {
            testing::Message::Message(&local_d08);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_cf0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb9c,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_38.message_,&local_d08);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
            testing::Message::~Message(&local_d08);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_d28 = SSL_get_dtls_write_sequence(psVar5,3);
          local_d2c = 0;
          testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                    ((internal *)local_d20,"SSL_get_dtls_write_sequence(server_.get(), 3)","0u",
                     &local_d28,&local_d2c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
          if (!bVar1) {
            testing::Message::Message(&local_d38);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d20);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb9f,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_39.message_,&local_d38);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
            testing::Message::~Message(&local_d38);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_d58 = SSL_get_dtls_read_sequence(psVar5,3);
          local_d5c = 0;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_d50,"SSL_get_dtls_read_sequence(client_.get(), 3)","0u",
                     &local_d58,&local_d5c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
          if (!bVar1) {
            testing::Message::Message(&local_d68);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xba0,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff290,&local_d68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff290)
            ;
            testing::Message::~Message(&local_d68);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          local_d8c = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              + 7),1);
          local_d90 = -1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_d88,"SSL_read(client_.get(), &byte, 1)","-1",&local_d8c,
                     &local_d90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
          if (!bVar1) {
            testing::Message::Message(&local_d98);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d88);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xba5,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_41.message_,&local_d98);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
            testing::Message::~Message(&local_d98);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          local_db4 = SSL_get_error(pSVar7,-1);
          local_db8 = 2;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_db0,"SSL_get_error(client_.get(), -1)","2",&local_db4,
                     &local_db8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
          if (!bVar1) {
            testing::Message::Message(&local_dc0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_db0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xba6,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_42.message_,&local_dc0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
            testing::Message::~Message(&local_dc0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
          (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_ddc = DTLSv1_handle_timeout(psVar5);
          local_de0 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_dd8,"DTLSv1_handle_timeout(client_.get())","1",&local_ddc,
                     &local_de0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
          if (!bVar1) {
            testing::Message::Message(&local_de8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__22.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xba8,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__22.message_,&local_de8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__22.message_);
            testing::Message::~Message(&local_de8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_e04 = SSL_is_dtls_handshake_idle(psVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_e00,&local_e04,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
          if (!bVar1) {
            testing::Message::Message(&local_e10);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_43.message_,(internal *)local_e00,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false","true"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_e18,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbab,pcVar4);
            testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
            testing::internal::AssertHelper::~AssertHelper(&local_e18);
            std::__cxx11::string::~string((string *)&gtest_ar_43.message_);
            testing::Message::~Message(&local_e10);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_e50 = SSL_get_dtls_write_sequence(psVar5,3);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_e58 = SSL_get_dtls_read_sequence(psVar5,3);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_e48,"SSL_get_dtls_write_sequence(server_.get(), 3)",
                     "SSL_get_dtls_read_sequence(client_.get(), 3)",&local_e50,&local_e58);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
          if (!bVar1) {
            testing::Message::Message(&local_e60);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbaf,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_44.message_,&local_e60);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
            testing::Message::~Message(&local_e60);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_e80 = SSL_get_dtls_write_sequence(psVar5,3);
          local_e84 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_e78,"SSL_get_dtls_write_sequence(client_.get(), 3)","1u",
                     &local_e80,&local_e84);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
          if (!bVar1) {
            testing::Message::Message(&local_e90);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e78);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbb2,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_45.message_,&local_e90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
            testing::Message::~Message(&local_e90);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).server_);
          local_eac = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              + 7),1);
          local_eb0 = -1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_ea8,"SSL_read(server_.get(), &byte, 1)","-1",&local_eac,
                     &local_eb0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea8);
          if (!bVar1) {
            testing::Message::Message(&local_eb8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ea8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbb5,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_46.message_,&local_eb8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
            testing::Message::~Message(&local_eb8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).server_);
          local_ed4 = SSL_get_error(pSVar7,-1);
          local_ed8 = 2;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_ed0,"SSL_get_error(server_.get(), -1)","2",&local_ed4,
                     &local_ed8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
          if (!bVar1) {
            testing::Message::Message(&local_ee0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ed0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbb6,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__23.message_,&local_ee0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
            testing::Message::~Message(&local_ee0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_efc = SSL_is_dtls_handshake_idle(psVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_ef8,&local_efc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
          if (!bVar1) {
            testing::Message::Message(&local_f08);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_47.message_,(internal *)local_ef8,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false","true"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_f10,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbb9,pcVar4);
            testing::internal::AssertHelper::operator=(&local_f10,&local_f08);
            testing::internal::AssertHelper::~AssertHelper(&local_f10);
            std::__cxx11::string::~string((string *)&gtest_ar_47.message_);
            testing::Message::~Message(&local_f08);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_f48 = SSL_get_dtls_write_sequence(psVar5,3);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_f50 = SSL_get_dtls_read_sequence(psVar5,3);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_f40,"SSL_get_dtls_write_sequence(client_.get(), 3)",
                     "SSL_get_dtls_read_sequence(server_.get(), 3)",&local_f48,&local_f50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
          if (!bVar1) {
            testing::Message::Message(&local_f58);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f40);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&old_seq,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbbd,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&old_seq,&local_f58);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_seq);
            testing::Message::~Message(&local_f58);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          gtest_ar_48.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )SSL_get_dtls_write_sequence(psVar5,3);
          gtest_ar_40.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 0x2a;
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).server_);
          local_f7c = SSL_write(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               + 7),1);
          local_f80 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_f78,"SSL_write(server_.get(), &byte, 1)","1",&local_f7c,
                     &local_f80);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f78);
          if (!bVar1) {
            testing::Message::Message(&local_f88);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f78);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_49.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xbc2,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_49.message_,&local_f88);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
            testing::Message::~Message(&local_f88);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f78);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      (&(this->super_SSLVersionTest).client_);
            local_fa4 = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                + 7),1);
            local_fa8 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_fa0,"SSL_read(client_.get(), &byte, 1)","1",&local_fa4,
                       &local_fa8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
            if (!bVar1) {
              testing::Message::Message(&local_fb0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_50.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xbc3,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_50.message_,&local_fb0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
              testing::Message::~Message(&local_fb0);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).server_);
              local_fd0 = SSL_get_dtls_write_sequence(psVar5,3);
              local_fd8 = (long)gtest_ar_48.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 1;
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_fc8,"SSL_get_dtls_write_sequence(server_.get(), 3)",
                         "old_seq + 1",&local_fd0,&local_fd8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc8);
              if (!bVar1) {
                testing::Message::Message(&local_fe0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_fc8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbc4,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_51.message_,&local_fe0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_51.message_);
                testing::Message::~Message(&local_fe0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc8);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              local_1000 = SSL_get_dtls_read_sequence(psVar5,3);
              local_1008 = (long)gtest_ar_48.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 1;
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_ff8,"SSL_get_dtls_read_sequence(client_.get(), 3)",
                         "old_seq + 1",&local_1000,&local_1008);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff8);
              if (!bVar1) {
                testing::Message::Message(&local_1010);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ff8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffefe8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbc5,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffefe8,&local_1010);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffefe8);
                testing::Message::~Message(&local_1010);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff8);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              gtest_ar_52.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = SSL_get_dtls_handshake_write_seq(psVar5);
              local_1034 = 0;
              testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                        ((internal *)local_1030,"client_hs_seq","0u",
                         (uint *)((long)&gtest_ar_52.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 4),&local_1034);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1030)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_1040);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1030);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbca,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_53.message_,&local_1040);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_53.message_);
                testing::Message::~Message(&local_1040);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).server_);
              local_105c = SSL_get_dtls_handshake_read_seq(psVar5);
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                        ((EqHelper *)local_1058,"client_hs_seq",
                         "SSL_get_dtls_handshake_read_seq(server_.get())",
                         (uint *)((long)&gtest_ar_52.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 4),&local_105c);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_1068);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1058);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffef90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbcb,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffef90,&local_1068);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffef90);
                testing::Message::~Message(&local_1068);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).server_);
              gtest_ar_54.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = SSL_get_dtls_handshake_write_seq(psVar5);
              local_108c = 0;
              testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                        ((internal *)local_1088,"server_hs_seq","0u",
                         (uint *)((long)&gtest_ar_54.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 4),&local_108c);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1088)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_1098);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1088);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbcd,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_55.message_,&local_1098);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_55.message_);
                testing::Message::~Message(&local_1098);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1088);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              local_10b4 = SSL_get_dtls_handshake_read_seq(psVar5);
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                        ((EqHelper *)local_10b0,"server_hs_seq",
                         "SSL_get_dtls_handshake_read_seq(client_.get())",
                         (uint *)((long)&gtest_ar_54.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 4),&local_10b4);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_10c0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbce,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__24.message_,&local_10c0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__24.message_);
                testing::Message::~Message(&local_10c0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              local_10dc = SSL_key_update(psVar5,1);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_10d8,&local_10dc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d8)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_10e8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__25.message_,(internal *)local_10d8,
                           (AssertionResult *)"SSL_key_update(client_.get(), 1)","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_10f0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xbd2,pcVar4);
                testing::internal::AssertHelper::operator=(&local_10f0,&local_10e8);
                testing::internal::AssertHelper::~AssertHelper(&local_10f0);
                std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
                testing::Message::~Message(&local_10e8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d8);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                iVar2 = SSL_is_dtls_handshake_idle(psVar5);
                local_1121 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_1120,&local_1121,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1120);
                if (!bVar1) {
                  testing::Message::Message(&local_1130);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_56.message_,(internal *)local_1120,
                             (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true",
                             "false",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1138,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbd3,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_1138,&local_1130);
                  testing::internal::AssertHelper::~AssertHelper(&local_1138);
                  std::__cxx11::string::~string((string *)&gtest_ar_56.message_);
                  testing::Message::~Message(&local_1130);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1120);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_116c = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7),1);
                local_1170 = -1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1168,"SSL_read(client_.get(), &byte, 1)","-1",
                           &local_116c,&local_1170);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1168);
                if (!bVar1) {
                  testing::Message::Message(&local_1178);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1168);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbd7,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_57.message_,&local_1178);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_57.message_);
                  testing::Message::~Message(&local_1178);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_1194 = SSL_get_error(pSVar7,-1);
                local_1198 = 2;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1190,"SSL_get_error(client_.get(), -1)","2",&local_1194
                           ,&local_1198);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1190);
                if (!bVar1) {
                  testing::Message::Message(&local_11a0);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1190);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__26.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbd8,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__26.message_,&local_11a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__26.message_);
                  testing::Message::~Message(&local_11a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                iVar2 = SSL_is_dtls_handshake_idle(psVar5);
                local_11b9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_11b8,&local_11b9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_11b8);
                if (!bVar1) {
                  testing::Message::Message(&local_11c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_58.message_,(internal *)local_11b8,
                             (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true",
                             "false",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_11d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbd9,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_11d0,&local_11c8);
                  testing::internal::AssertHelper::~AssertHelper(&local_11d0);
                  std::__cxx11::string::~string((string *)&gtest_ar_58.message_);
                  testing::Message::~Message(&local_11c8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_1202 = SSL_get_dtls_write_epoch(psVar5);
                local_1208 = 3;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1200,"SSL_get_dtls_write_epoch(client_.get())","3",
                           &local_1202,&local_1208);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1200);
                if (!bVar1) {
                  testing::Message::Message(&local_1210);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1200);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbdc,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_59.message_,&local_1210);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_59.message_);
                  testing::Message::~Message(&local_1210);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1200);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).server_);
                local_122c = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7),1);
                local_1230 = -1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1228,"SSL_read(server_.get(), &byte, 1)","-1",
                           &local_122c,&local_1230);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1228);
                if (!bVar1) {
                  testing::Message::Message(&local_1238);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe1,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_60.message_,&local_1238);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_60.message_);
                  testing::Message::~Message(&local_1238);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).server_);
                local_1254 = SSL_get_error(pSVar7,-1);
                local_1258 = 2;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1250,"SSL_get_error(server_.get(), -1)","2",&local_1254
                           ,&local_1258);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1250);
                if (!bVar1) {
                  testing::Message::Message(&local_1260);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1250);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe2,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_61.message_,&local_1260);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_61.message_);
                  testing::Message::~Message(&local_1260);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
                (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_127c = DTLSv1_handle_timeout(psVar5);
                local_1280 = 1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1278,"DTLSv1_handle_timeout(server_.get())","1",
                           &local_127c,&local_1280);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1278);
                if (!bVar1) {
                  testing::Message::Message(&local_1288);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1278);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe4,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_62.message_,&local_1288);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_62.message_);
                  testing::Message::~Message(&local_1288);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1278);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_12a2 = SSL_get_dtls_read_epoch(psVar5);
                local_12a8 = 4;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_12a0,"SSL_get_dtls_read_epoch(server_.get())","4",
                           &local_12a2,&local_12a8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_12a0);
                if (!bVar1) {
                  testing::Message::Message(&local_12b0);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_12a0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe5,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_63.message_,&local_12b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_63.message_);
                  testing::Message::~Message(&local_12b0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a0);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_12d0 = SSL_get_dtls_read_sequence(psVar5,4);
                local_12d4 = 0;
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                          ((EqHelper *)local_12c8,"SSL_get_dtls_read_sequence(server_.get(), 4)",
                           "0u",&local_12d0,&local_12d4);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_12c8);
                if (!bVar1) {
                  testing::Message::Message(&local_12e0);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_12c8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__27.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe6,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__27.message_,&local_12e0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__27.message_);
                  testing::Message::~Message(&local_12e0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                iVar2 = SSL_is_dtls_handshake_idle(psVar5);
                local_12f9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_12f8,&local_12f9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_12f8);
                if (!bVar1) {
                  testing::Message::Message(&local_1308);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_64.message_,(internal *)local_12f8,
                             (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true",
                             "false",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1310,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbe9,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_1310,&local_1308);
                  testing::internal::AssertHelper::~AssertHelper(&local_1310);
                  std::__cxx11::string::~string((string *)&gtest_ar_64.message_);
                  testing::Message::~Message(&local_1308);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_1342 = SSL_get_dtls_write_epoch(psVar5);
                local_1348 = 3;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1340,"SSL_get_dtls_write_epoch(server_.get())","3",
                           &local_1342,&local_1348);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1340);
                if (!bVar1) {
                  testing::Message::Message(&local_1350);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1340);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbea,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_65.message_,&local_1350);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_65.message_);
                  testing::Message::~Message(&local_1350);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1340);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_136c = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7),1);
                local_1370 = -1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1368,"SSL_read(client_.get(), &byte, 1)","-1",
                           &local_136c,&local_1370);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1368);
                if (!bVar1) {
                  testing::Message::Message(&local_1378);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1368);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbee,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_66.message_,&local_1378);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_66.message_);
                  testing::Message::~Message(&local_1378);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_1394 = SSL_get_error(pSVar7,-1);
                local_1398 = 2;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1390,"SSL_get_error(client_.get(), -1)","2",&local_1394
                           ,&local_1398);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1390);
                if (!bVar1) {
                  testing::Message::Message(&local_13a0);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1390);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbef,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_67.message_,&local_13a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_67.message_);
                  testing::Message::~Message(&local_13a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1390);
                (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_13bc = DTLSv1_handle_timeout(psVar5);
                local_13c0 = 1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_13b8,"DTLSv1_handle_timeout(client_.get())","1",
                           &local_13bc,&local_13c0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_13b8);
                if (!bVar1) {
                  testing::Message::Message(&local_13c8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_13b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__28.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbf1,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__28.message_,&local_13c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__28.message_);
                  testing::Message::~Message(&local_13c8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_13e4 = SSL_is_dtls_handshake_idle(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_13e0,&local_13e4,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_13e0);
                if (!bVar1) {
                  testing::Message::Message(&local_13f0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_68.message_,(internal *)local_13e0,
                             (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false",
                             "true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_13f8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbf6,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_13f8,&local_13f0);
                  testing::internal::AssertHelper::~AssertHelper(&local_13f8);
                  std::__cxx11::string::~string((string *)&gtest_ar_68.message_);
                  testing::Message::~Message(&local_13f0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e0);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_142a = SSL_get_dtls_read_epoch(psVar5);
                local_1430 = 4;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1428,"SSL_get_dtls_read_epoch(client_.get())","4",
                           &local_142a,&local_1430);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1428);
                if (!bVar1) {
                  testing::Message::Message(&local_1438);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1428);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbf7,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_69.message_,&local_1438);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_69.message_);
                  testing::Message::~Message(&local_1438);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1428);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_1452 = SSL_get_dtls_write_epoch(psVar5);
                local_1458 = 4;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1450,"SSL_get_dtls_write_epoch(client_.get())","4",
                           &local_1452,&local_1458);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1450);
                if (!bVar1) {
                  testing::Message::Message(&local_1460);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1450);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbf8,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_70.message_,&local_1460);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_70.message_);
                  testing::Message::~Message(&local_1460);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1450);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                TestBody::anon_class_16_2_625711b6::operator()
                          ((anon_class_16_2_625711b6 *)&gtest_ar_34.message_,psVar5,psVar6,4);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).server_);
                local_147c = SSL_read(pSVar7,(void *)((long)&gtest_ar_40.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7),1);
                local_1480 = -1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_1478,"SSL_read(server_.get(), &byte, 1)","-1",
                           &local_147c,&local_1480);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1478);
                if (!bVar1) {
                  testing::Message::Message(&local_1488);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1478);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xbff,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_71.message_,&local_1488);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_71.message_);
                  testing::Message::~Message(&local_1488);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1478);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).server_);
                local_14a4 = SSL_get_error(pSVar7,-1);
                local_14a8 = 2;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_14a0,"SSL_get_error(server_.get(), -1)","2",&local_14a4
                           ,&local_14a8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_14a0);
                if (!bVar1) {
                  testing::Message::Message(&local_14b0);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_14a0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc00,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__29.message_,&local_14b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__29.message_);
                  testing::Message::~Message(&local_14b0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_14a0);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_14cc = SSL_is_dtls_handshake_idle(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_14c8,&local_14cc,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_14c8);
                if (!bVar1) {
                  testing::Message::Message(&local_14d8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_72.message_,(internal *)local_14c8,
                             (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false",
                             "true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_14e0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc01,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_14e0,&local_14d8);
                  testing::internal::AssertHelper::~AssertHelper(&local_14e0);
                  std::__cxx11::string::~string((string *)&gtest_ar_72.message_);
                  testing::Message::~Message(&local_14d8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_1512 = SSL_get_dtls_read_epoch(psVar5);
                local_1518 = 4;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1510,"SSL_get_dtls_read_epoch(server_.get())","4",
                           &local_1512,&local_1518);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1510);
                if (!bVar1) {
                  testing::Message::Message(&local_1520);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1510);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_73.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc02,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_73.message_,&local_1520);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_73.message_);
                  testing::Message::~Message(&local_1520);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1510);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_153a = SSL_get_dtls_write_epoch(psVar5);
                local_1540 = 4;
                testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                          ((EqHelper *)local_1538,"SSL_get_dtls_write_epoch(server_.get())","4",
                           &local_153a,&local_1540);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1538);
                if (!bVar1) {
                  testing::Message::Message(&local_1548);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1538);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc03,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__30.message_,&local_1548);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__30.message_);
                  testing::Message::~Message(&local_1548);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1538);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                TestBody::anon_class_16_2_625711b6::operator()
                          ((anon_class_16_2_625711b6 *)&gtest_ar_34.message_,psVar5,psVar6,4);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_1564 = SSL_get_dtls_read_traffic_secret
                                       (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,3);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_1560,&local_1564,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1560);
                if (!bVar1) {
                  testing::Message::Message(&local_1570);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__31.message_,(internal *)local_1560,
                             (AssertionResult *)
                             "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3)",
                             "false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1578,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc0a,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_1578,&local_1570);
                  testing::internal::AssertHelper::~AssertHelper(&local_1578);
                  std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
                  testing::Message::~Message(&local_1570);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1560);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_15ac = SSL_get_dtls_read_traffic_secret
                                       (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,3);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_15a8,&local_15ac,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_15a8);
                if (!bVar1) {
                  testing::Message::Message(&local_15b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_74.message_,(internal *)local_15a8,
                             (AssertionResult *)
                             "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 3)",
                             "false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_15c0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc0b,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_15c0,&local_15b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_15c0);
                  std::__cxx11::string::~string((string *)&gtest_ar_74.message_);
                  testing::Message::~Message(&local_15b8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_15a8);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_15f4 = SSL_get_dtls_handshake_write_seq(psVar5);
                local_15f8 = gtest_ar_52.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_ + 1;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          ((EqHelper *)local_15f0,"SSL_get_dtls_handshake_write_seq(client_.get())",
                           "client_hs_seq + 1",&local_15f4,&local_15f8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_15f0);
                if (!bVar1) {
                  testing::Message::Message(&local_1600);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_15f0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc0e,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_75.message_,&local_1600);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_75.message_);
                  testing::Message::~Message(&local_1600);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_15f0);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_161c = SSL_get_dtls_handshake_read_seq(psVar5);
                local_1620 = gtest_ar_52.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_ + 1;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          ((EqHelper *)local_1618,"SSL_get_dtls_handshake_read_seq(server_.get())",
                           "client_hs_seq + 1",&local_161c,&local_1620);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1618);
                if (!bVar1) {
                  testing::Message::Message(&local_1628);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1618);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc0f,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_76.message_,&local_1628);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_76.message_);
                  testing::Message::~Message(&local_1628);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1618);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                local_1644 = SSL_get_dtls_handshake_write_seq(psVar5);
                local_1648 = gtest_ar_54.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_ + 1;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          ((EqHelper *)local_1640,"SSL_get_dtls_handshake_write_seq(server_.get())",
                           "server_hs_seq + 1",&local_1644,&local_1648);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1640);
                if (!bVar1) {
                  testing::Message::Message(&local_1650);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1640);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc10,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_77.message_,&local_1650);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_77.message_);
                  testing::Message::~Message(&local_1650);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_);
                local_166c = SSL_get_dtls_handshake_read_seq(psVar5);
                local_1670 = gtest_ar_54.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_ + 1;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          ((EqHelper *)local_1668,"SSL_get_dtls_handshake_read_seq(client_.get())",
                           "server_hs_seq + 1",&local_166c,&local_1670);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1668);
                if (!bVar1) {
                  testing::Message::Message(&local_1678);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1668);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1680,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xc11,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_1680,&local_1678);
                  testing::internal::AssertHelper::~AssertHelper(&local_1680);
                  testing::Message::~Message(&local_1678);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1668);
              }
            }
          }
        }
        else {
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_66c = SSL_is_dtls_handshake_idle(psVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_668,&local_66c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
          if (!bVar1) {
            testing::Message::Message(&local_678);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__13.message_,(internal *)local_668,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false","true"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_680,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb53,pcVar4);
            testing::internal::AssertHelper::operator=(&local_680,&local_678);
            testing::internal::AssertHelper::~AssertHelper(&local_680);
            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
            testing::Message::~Message(&local_678);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_6b4 = SSL_is_dtls_handshake_idle(psVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_6b0,&local_6b4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
          if (!bVar1) {
            testing::Message::Message(&local_6c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_16.message_,(internal *)local_6b0,
                       (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false","true"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_6c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb54,pcVar4);
            testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
            testing::internal::AssertHelper::~AssertHelper(&local_6c8);
            std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
            testing::Message::~Message(&local_6c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_6fa = SSL_get_dtls_read_epoch(psVar5);
          local_700 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_6f8,"SSL_get_dtls_read_epoch(client_.get())","1",&local_6fa,
                     &local_700);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
          if (!bVar1) {
            testing::Message::Message(&local_708);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb57,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_17.message_,&local_708);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
            testing::Message::~Message(&local_708);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_722 = SSL_get_dtls_write_epoch(psVar5);
          local_728 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_720,"SSL_get_dtls_write_epoch(server_.get())","1",&local_722,
                     &local_728);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
          if (!bVar1) {
            testing::Message::Message(&local_730);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb58,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_18.message_,&local_730);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
            testing::Message::~Message(&local_730);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_74a = SSL_get_dtls_read_epoch(psVar5);
          local_750 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_748,"SSL_get_dtls_read_epoch(server_.get())","1",&local_74a,
                     &local_750);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
          if (!bVar1) {
            testing::Message::Message(&local_758);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb59,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_19.message_,&local_758);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
            testing::Message::~Message(&local_758);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_772 = SSL_get_dtls_write_epoch(psVar5);
          local_778 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_770,"SSL_get_dtls_write_epoch(client_.get())","1",&local_772,
                     &local_778);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
          if (!bVar1) {
            testing::Message::Message(&local_780);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb5a,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_20.message_,&local_780);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
            testing::Message::~Message(&local_780);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_7a0 = SSL_get_dtls_read_sequence(psVar5,1);
          local_7a4 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_798,"SSL_get_dtls_read_sequence(client_.get(), 1)","1u",
                     &local_7a0,&local_7a4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
          if (!bVar1) {
            testing::Message::Message(&local_7b0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb5d,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_21.message_,&local_7b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
            testing::Message::~Message(&local_7b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_7d0 = SSL_get_dtls_write_sequence(psVar5,1);
          local_7d4 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_7c8,"SSL_get_dtls_write_sequence(server_.get(), 1)","1u",
                     &local_7d0,&local_7d4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
          if (!bVar1) {
            testing::Message::Message(&local_7e0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb5e,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_22.message_,&local_7e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
            testing::Message::~Message(&local_7e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_800 = SSL_get_dtls_read_sequence(psVar5,1);
          local_804 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_7f8,"SSL_get_dtls_read_sequence(server_.get(), 1)","1u",
                     &local_800,&local_804);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
          if (!bVar1) {
            testing::Message::Message(&local_810);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb5f,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_23.message_,&local_810);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
            testing::Message::~Message(&local_810);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_830 = SSL_get_dtls_write_sequence(psVar5,1);
          local_834 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_828,"SSL_get_dtls_write_sequence(client_.get(), 1)","1u",
                     &local_830,&local_834);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
          if (!bVar1) {
            testing::Message::Message(&local_840);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb60,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__14.message_,&local_840);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14.message_);
            testing::Message::~Message(&local_840);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          iVar2 = SSL_get_dtls_read_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
          local_859 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_858,&local_859,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
          if (!bVar1) {
            testing::Message::Message(&local_868);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__15.message_,(internal *)local_858,
                       (AssertionResult *)
                       "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_870,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb64,pcVar4);
            testing::internal::AssertHelper::operator=(&local_870,&local_868);
            testing::internal::AssertHelper::~AssertHelper(&local_870);
            std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
            testing::Message::~Message(&local_868);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          iVar2 = SSL_get_dtls_write_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
          local_8a1 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
          if (!bVar1) {
            testing::Message::Message(&local_8b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__16.message_,(internal *)local_8a0,
                       (AssertionResult *)
                       "SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_8b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb66,pcVar4);
            testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
            testing::internal::AssertHelper::~AssertHelper(&local_8b8);
            std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
            testing::Message::~Message(&local_8b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          iVar2 = SSL_get_dtls_read_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
          local_8e9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
          if (!bVar1) {
            testing::Message::Message(&local_8f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__17.message_,(internal *)local_8e8,
                       (AssertionResult *)
                       "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_900,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb68,pcVar4);
            testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
            testing::internal::AssertHelper::~AssertHelper(&local_900);
            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
            testing::Message::~Message(&local_8f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          iVar2 = SSL_get_dtls_write_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_,1);
          local_931 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_930,&local_931,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
          if (!bVar1) {
            testing::Message::Message(&local_940);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_968,(internal *)local_930,
                       (AssertionResult *)
                       "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_948,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb6a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_948,&local_940);
            testing::internal::AssertHelper::~AssertHelper(&local_948);
            std::__cxx11::string::~string((string *)local_968);
            testing::Message::~Message(&local_940);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
          gtest_ar_24.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 0;
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          local_984 = SSL_write(pSVar7,(void *)((long)&gtest_ar_24.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               + 7),1);
          local_988 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_980,"SSL_write(client_.get(), &byte, 1)","1",&local_984,
                     &local_988);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
          if (!bVar1) {
            testing::Message::Message(&local_990);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb6e,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_25.message_,&local_990);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
            testing::Message::~Message(&local_990);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).server_);
          local_9ac = SSL_read(pSVar7,(void *)((long)&gtest_ar_24.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              + 7),1);
          local_9b0 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_9a8,"SSL_read(server_.get(), &byte, 1)","1",&local_9ac,
                     &local_9b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
          if (!bVar1) {
            testing::Message::Message(&local_9b8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb6f,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_26.message_,&local_9b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
            testing::Message::~Message(&local_9b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_9d8 = SSL_get_dtls_read_sequence(psVar5,1);
          local_9dc = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_9d0,"SSL_get_dtls_read_sequence(client_.get(), 1)","1u",
                     &local_9d8,&local_9dc);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
          if (!bVar1) {
            testing::Message::Message(&local_9e8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb72,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_27.message_,&local_9e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
            testing::Message::~Message(&local_9e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_a08 = SSL_get_dtls_write_sequence(psVar5,1);
          local_a0c = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_a00,"SSL_get_dtls_write_sequence(server_.get(), 1)","1u",
                     &local_a08,&local_a0c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
          if (!bVar1) {
            testing::Message::Message(&local_a18);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb73,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_28.message_,&local_a18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
            testing::Message::~Message(&local_a18);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_);
          local_a38 = SSL_get_dtls_read_sequence(psVar5,1);
          local_a3c = 2;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_a30,"SSL_get_dtls_read_sequence(server_.get(), 1)","2u",
                     &local_a38,&local_a3c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
          if (!bVar1) {
            testing::Message::Message(&local_a48);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb74,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_29.message_,&local_a48);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
            testing::Message::~Message(&local_a48);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_a68 = SSL_get_dtls_write_sequence(psVar5,1);
          local_a6c = 2;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_a60,"SSL_get_dtls_write_sequence(client_.get(), 1)","2u",
                     &local_a68,&local_a6c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
          if (!bVar1) {
            testing::Message::Message(&local_a78);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb75,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__18.message_,&local_a78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__18.message_);
            testing::Message::~Message(&local_a78);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordStateDTLS) {
  if (!is_dtls()) {
    return;
  }

  SSL_CTX_set_current_time_cb(client_ctx_.get(), CurrentTimeCallback);
  SSL_CTX_set_current_time_cb(server_ctx_.get(), CurrentTimeCallback);

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  // The handshake is incomplete.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));

  // The initial epoch is zero.
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 0);

  // We have not sent or received any records.
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 0), 0u);

  // We have not sent or received any handshake messages.
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(client_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(server_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(server_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(client_.get()), 0u);

  // Though it exists, epoch zero is unencrypted and does not have traffic
  // secrets.
  const uint8_t *data;
  size_t len;
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 0));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 0));
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 0));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 0));

  // Other epochs do not exist yet.
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), UINT64_MAX);
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1));
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1));

  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));

  // DTLS 1.0 and 1.2 are relative simple.
  if (!is_tls13()) {
    // This handshake is now idle.
    EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));
    EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));

    // Both sides of both channels are at epoch 1.
    EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 1);

    // Both sides have sent one record at epoch 1 each (Finished).
    EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), 1u);

    // DTLS 1.2 does not use traffic secrets.
    EXPECT_FALSE(
        SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1));

    // Send a record from client to server.
    uint8_t byte = 0;
    EXPECT_EQ(SSL_write(client_.get(), &byte, 1), 1);
    EXPECT_EQ(SSL_read(server_.get(), &byte, 1), 1);

    // Sequence numbers should have updated.
    EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), 2u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), 2u);
    return;
  }

  // The client sent Finished, which the server ACKed, but the client hasn't
  // consumed the ACK.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  // The server sent NewSessionTicket, which the client hasn't consumed yet.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));

  // Both sides of both channels are at epoch 3.
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 3);

  auto check_matching_secret = [&](SSL *reader, SSL *writer, uint16_t epoch) {
    ASSERT_TRUE(SSL_get_dtls_read_traffic_secret(reader, &data, &len, epoch));
    auto read_secret = Span(data, len);
    ASSERT_TRUE(SSL_get_dtls_write_traffic_secret(writer, &data, &len, epoch));
    auto write_secret = Span(data, len);
    EXPECT_EQ(Bytes(read_secret), Bytes(write_secret));
  };

  // Traffic secrets at epoch 3 should match.
  check_matching_secret(client_.get(), server_.get(), 3);
  check_matching_secret(server_.get(), client_.get(), 3);

  // Both sides retain read epoch 2 (but not write epoch 2). The server must
  // retain epoch 2 because it does not know the client has seen the ACK and
  // therefore must respond to retransmissions of the client's final flight.
  // The client could discard epoch 2, but our implementation happens not to.
  EXPECT_LT(SSL_get_dtls_read_sequence(client_.get(), 2), UINT64_MAX);
  EXPECT_LT(SSL_get_dtls_read_sequence(server_.get(), 2), UINT64_MAX);
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 2));
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 2));

  // The client has not sent anything over epoch 3.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 3), 0u);

  // The server has (ACK and NewSessionTicket), but the client has not seen it.
  EXPECT_GT(SSL_get_dtls_write_sequence(server_.get(), 3), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 3), 0u);

  // Read from the client. No application data, but this will consume the
  // records. We send ACKs on a timer, so advance the clock to flush it.
  uint8_t byte;
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(client_.get()), 1);

  // The client has now picked up the ACK and is idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));

  // The client has caught up to what the server wrote.
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 3),
            SSL_get_dtls_read_sequence(client_.get(), 3));

  // The client saw NewSessionTicket and sent an ACK.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3), 1u);

  // Pick up the ACK from the server.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);

  // Now the server is also idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));

  // The server has seen the ACK and has caught up to the client.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3),
            SSL_get_dtls_read_sequence(server_.get(), 3));

  // Exchange some data. Sequence numbers should increment.
  uint64_t old_seq = SSL_get_dtls_write_sequence(server_.get(), 3);
  byte = 42;
  ASSERT_EQ(SSL_write(server_.get(), &byte, 1), 1);
  ASSERT_EQ(SSL_read(client_.get(), &byte, 1), 1);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 3), old_seq + 1);
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 3), old_seq + 1);

  // Now that everyone's caught up, handshake sequence numbers should be
  // non-zero and match.
  uint32_t client_hs_seq = SSL_get_dtls_handshake_write_seq(client_.get());
  EXPECT_NE(client_hs_seq, 0u);
  EXPECT_EQ(client_hs_seq, SSL_get_dtls_handshake_read_seq(server_.get()));
  uint32_t server_hs_seq = SSL_get_dtls_handshake_write_seq(server_.get());
  EXPECT_NE(server_hs_seq, 0u);
  EXPECT_EQ(server_hs_seq, SSL_get_dtls_handshake_read_seq(client_.get()));

  // Enqueue a KeyUpdate that requests the peer do the same. The client is now
  // busy.
  ASSERT_TRUE(SSL_key_update(client_.get(), SSL_KEY_UPDATE_REQUESTED));
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  // Flush the KeyUpdate to the transport. (We currently flush incidental
  // traffic on read because callers are expected to be constantly reading.)
  // The client has an unacked message, so it is still busy.
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));

  // KeyUpdates are driven by ACKs, so the client is still at epoch 3.
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 3);

  // Consume the KeyUpdate on the server and wait for the ACK timer. The server
  // has now ACKed the KeyUpdate, advanced to read epoch 4, and sent a KeyUpdate
  // of its own.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(server_.get()), 1);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 4), 0u);

  // The server has an outstanding unacked KeyUpdate, so it is busy.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 3);

  // Consume the ACK and new KeyUpdate on the client. Wait the ACK timer for the
  // client to flush its ACK.
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(client_.get()), 1);

  // The client has now seen the ACK to its KeyUpdate, advancing its write
  // state, and seen the server's KeyUpdate, advancing its read state. It is
  // now idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 4);

  // Both sides now have epoch 4 of the client write channel.
  check_matching_secret(/*reader=*/server_.get(), /*writer=*/client_.get(), 4);

  // Finally, consume the ACK on the server. The server applies the KeyUpdate
  // and is also idle.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 4);

  // Both sides now have epoch 4 of the server write channel.
  check_matching_secret(/*reader=*/client_.get(), /*writer=*/server_.get(), 4);

  // Both sides still retain read epoch 3 because neither side has received data
  // at epoch 4 and cannot be sure the ACK has gotten through.
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3));
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 3));

  // Handshake sequence numbers should have incremented.
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(client_.get()), client_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(server_.get()), client_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(server_.get()), server_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(client_.get()), server_hs_seq + 1);
}